

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

void __thiscall QMainWindow::setCentralWidget(QMainWindow *this,QWidget *widget)

{
  long lVar1;
  QWidget *pQVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  pQVar2 = QMainWindowLayout::centralWidget(*(QMainWindowLayout **)(lVar1 + 0x260));
  if (pQVar2 != (QWidget *)0x0) {
    pQVar2 = QMainWindowLayout::centralWidget(*(QMainWindowLayout **)(lVar1 + 0x260));
    if (pQVar2 != widget) {
      pQVar2 = QMainWindowLayout::centralWidget(*(QMainWindowLayout **)(lVar1 + 0x260));
      QWidget::hide(pQVar2);
      QMainWindowLayout::centralWidget(*(QMainWindowLayout **)(lVar1 + 0x260));
      QObject::deleteLater();
    }
  }
  QMainWindowLayout::setCentralWidget(*(QMainWindowLayout **)(lVar1 + 0x260),widget);
  return;
}

Assistant:

void QMainWindow::setCentralWidget(QWidget *widget)
{
    Q_D(QMainWindow);
    if (d->layout->centralWidget() && d->layout->centralWidget() != widget) {
        d->layout->centralWidget()->hide();
        d->layout->centralWidget()->deleteLater();
    }
    d->layout->setCentralWidget(widget);
}